

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O3

int __thiscall
musicBlock::occupyChannel
          (musicBlock *this,uint slot,uint channel,int note,int volume,OP2instrEntry *instrument,
          uchar secondary)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  OPL2instrument *instr;
  bool bVar6;
  
  this->channels[slot].channel = (uchar)channel;
  this->channels[slot].note = (uchar)note;
  this->channels[slot].flags = secondary != '\0';
  if (0x27 < (this->driverdata).channelModulation[channel]) {
    this->channels[slot].flags = secondary != '\0' | 4;
  }
  this->channels[slot].time = this->MLtime;
  if (volume == -1) {
    volume = (int)(this->driverdata).channelLastVolume[channel];
  }
  else {
    (this->driverdata).channelLastVolume[channel] = (uchar)volume;
  }
  uVar5 = (uint)(((ulong)(uint)volume * (ulong)(this->driverdata).channelVolume[channel] *
                 (ulong)(this->driverdata).channelExpression[channel]) / 0x3f01);
  uVar2 = 0x7f;
  if (uVar5 < 0x7f) {
    uVar2 = uVar5;
  }
  this->channels[slot].volume = volume;
  this->channels[slot].realvolume = uVar2;
  uVar1 = instrument->flags;
  if ((uVar1 & 1) == 0) {
    if (channel == 0xf) {
      note = 0x3c;
    }
  }
  else {
    note = (int)instrument->note;
  }
  if ((uVar1 & 4) == 0 || secondary == '\0') {
    cVar4 = '\0';
  }
  else {
    cVar4 = (char)(instrument->finetune + 0x180 >> 1);
  }
  bVar6 = secondary != '\0';
  this->channels[slot].finetune = cVar4;
  this->channels[slot].pitch = (int)(this->driverdata).channelPitch[channel] + (int)cVar4;
  instr = instrument->instr + bVar6;
  this->channels[slot].instr = instr;
  uVar2 = note;
  if (channel != 0xf && (uVar1 & 1) == 0) {
    iVar3 = (int)instrument->instr[bVar6].basenote;
    uVar2 = note + iVar3;
    if ((int)uVar2 < 0) {
      uVar5 = 0xfffffff4;
      if (0xfffffff4 < uVar2) {
        uVar5 = uVar2;
      }
      uVar2 = iVar3 + note + ((uVar5 - (uVar2 + (uVar2 < 0xfffffff4))) / 0xc +
                             (uint)(uVar2 < 0xfffffff4)) * 0xc + 0xc;
    }
    else if (0x7f < uVar2) {
      iVar3 = uVar2 - 0x8b;
      if (uVar2 < 0x8b) {
        iVar3 = 0;
      }
      uVar2 = (uVar2 + ((iVar3 + 0xbU) % 0xc - (iVar3 + 0xbU))) - 0xc;
    }
  }
  this->channels[slot].realnote = (uchar)uVar2;
  OPLio::OPLwriteInstrument(this->io,slot,instr);
  if ((this->channels[slot].flags & 4) != 0) {
    OPLio::OPLwriteChannel
              (this->io,0x20,slot,(instrument->instr[bVar6].feedback & 1) << 6 | instr->trem_vibr_1,
               instrument->instr[bVar6].trem_vibr_2 | 0x40);
  }
  OPLio::OPLwritePan(this->io,slot,instr,(int)(this->driverdata).channelPan[channel]);
  OPLio::OPLwriteVolume(this->io,slot,instr,this->channels[slot].realvolume);
  OPLio::OPLwriteFreq(this->io,slot,uVar2,this->channels[slot].pitch,1);
  return slot;
}

Assistant:

int musicBlock::occupyChannel(uint slot, uint channel,
						 int note, int volume, struct OP2instrEntry *instrument, uchar secondary)
{
	struct OPL2instrument *instr;
	struct channelEntry *ch = &channels[slot];

	ch->channel = channel;
	ch->note = note;
	ch->flags = secondary ? CH_SECONDARY : 0;
	if (driverdata.channelModulation[channel] >= MOD_MIN)
		ch->flags |= CH_VIBRATO;
	ch->time = MLtime;
	if (volume == -1)
		volume = driverdata.channelLastVolume[channel];
	else
		driverdata.channelLastVolume[channel] = volume;
	ch->realvolume = calcVolume(driverdata.channelVolume[channel],
		driverdata.channelExpression[channel], ch->volume = volume);
	if (instrument->flags & FL_FIXED_PITCH)
		note = instrument->note;
	else if (channel == PERCUSSION)
		note = 60;			// C-5
	if (secondary && (instrument->flags & FL_DOUBLE_VOICE))
		ch->finetune = (instrument->finetune - 0x80) >> 1;
	else
		ch->finetune = 0;
	ch->pitch = ch->finetune + driverdata.channelPitch[channel];
	if (secondary)
		instr = &instrument->instr[1];
	else
		instr = &instrument->instr[0];
	ch->instr = instr;
	if (channel != PERCUSSION && !(instrument->flags & FL_FIXED_PITCH))
	{
		if ( (note += instr->basenote) < 0)
			while ((note += 12) < 0) {}
		else if (note > HIGHEST_NOTE)
			while ((note -= 12) > HIGHEST_NOTE) {}
	}
	ch->realnote = note;

	io->OPLwriteInstrument(slot, instr);
	if (ch->flags & CH_VIBRATO)
		writeModulation(slot, instr, 1);
	io->OPLwritePan(slot, instr, driverdata.channelPan[channel]);
	io->OPLwriteVolume(slot, instr, ch->realvolume);
	writeFrequency(slot, note, ch->pitch, 1);
	return slot;
}